

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

void __thiscall
Diligent::DescriptorSetAllocator::~DescriptorSetAllocator(DescriptorSetAllocator *this)

{
  char (*in_RCX) [205];
  string msg;
  string local_28;
  
  if (*(int *)&(this->super_DescriptorPoolManager).field_0xc4 != 0) {
    FormatString<std::atomic<int>,char[205]>
              (&local_28,(Diligent *)&(this->super_DescriptorPoolManager).field_0xc4,
               (atomic<int> *)
               " descriptor set(s) have not been returned to the allocator. If there are outstanding references to the sets in release queues, the app will crash when DescriptorSetAllocator::FreeDescriptorSet() is called"
               ,in_RCX);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"~DescriptorSetAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
               ,0xc3);
    std::__cxx11::string::~string((string *)&local_28);
  }
  DescriptorPoolManager::~DescriptorPoolManager(&this->super_DescriptorPoolManager);
  return;
}

Assistant:

DescriptorSetAllocator::~DescriptorSetAllocator()
{
    DEV_CHECK_ERR(m_AllocatedSetCounter == 0, m_AllocatedSetCounter, " descriptor set(s) have not been returned to the allocator. If there are outstanding references to the sets in release queues, the app will crash when DescriptorSetAllocator::FreeDescriptorSet() is called");
}